

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitBrIf(WasmBytecodeGenerator *this)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  WasmReaderBase *pWVar6;
  undefined4 *puVar7;
  PolymorphicEmitInfo PVar8;
  PolymorphicEmitInfo PVar9;
  EmitInfo local_6c;
  EmitInfo local_64;
  uint local_5c;
  WasmBytecodeGenerator *pWStack_58;
  uint32 i;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 local_50;
  uint local_48;
  undefined4 uStack_44;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 local_40;
  BlockInfo *local_38;
  BlockInfo *blockInfo;
  EmitInfo conditionInfo;
  uint32 depth;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo info;
  
  unique0x10000300 = this;
  pWVar6 = GetReader(this);
  conditionInfo.super_EmitInfoBase.location = (pWVar6->m_currentNode).field_1.br.depth;
  register0x00000000 = PopEvalStack(this,FirstLocalType,L"br_if condition must have i32 type");
  ReleaseLocation(this,(EmitInfo *)((long)&blockInfo + 4));
  PolymorphicEmitInfo::PolymorphicEmitInfo((PolymorphicEmitInfo *)&this_local);
  local_38 = GetBlockInfo(this,conditionInfo.super_EmitInfoBase.location);
  bVar3 = BlockInfo::HasYield(local_38);
  if (bVar3) {
    PVar8 = PopStackPolymorphic(this,local_38,(char16 *)0x0);
    local_50 = PVar8.field_1;
    local_48 = PVar8.count;
    pWStack_58 = (WasmBytecodeGenerator *)CONCAT44(uStack_44,local_48);
    PVar8._4_4_ = 0;
    PVar8.count = local_48;
    PVar8.field_1.singleInfo = local_50.singleInfo;
    local_40 = local_50;
    this_local = pWStack_58;
    info._0_8_ = local_50;
    YieldToBlock(this,local_38,PVar8);
    bVar3 = PolymorphicEmitInfo::IsUnreachable((PolymorphicEmitInfo *)&this_local);
    if (bVar3) {
      bVar3 = IsUnreachable(this);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x6f0,"(IsUnreachable())","IsUnreachable()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      uVar4 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local);
      uVar5 = PolymorphicEmitInfo::Count(&local_38->yieldInfo);
      if (uVar4 != uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x6f1,"(info.Count() == blockInfo->yieldInfo.Count())",
                           "info.Count() == blockInfo->yieldInfo.Count()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      for (local_5c = 0; uVar2 = local_5c,
          uVar4 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local), uVar2 < uVar4;
          local_5c = local_5c + 1) {
        local_6c = PolymorphicEmitInfo::GetInfo(&local_38->yieldInfo,local_5c);
        EmitInfo::EmitInfo(&local_64,&local_6c.type);
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)&this_local,local_64,local_5c);
      }
    }
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])
            (this->m_writer,0x26,(ulong)(uint)local_38->label,
             (ulong)stack0xffffffffffffffd4 & 0xffffffff);
  PVar9._0_8_ = (ulong)this_local & 0xffffffff;
  PVar9.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
  return PVar9;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitBrIf()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("br_if condition must have i32 type"));
    ReleaseLocation(&conditionInfo);

    PolymorphicEmitInfo info;
    BlockInfo* blockInfo = GetBlockInfo(depth);

    if (blockInfo->HasYield())
    {
        info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        if (info.IsUnreachable())
        {
            Assert(IsUnreachable());
            Assert(info.Count() == blockInfo->yieldInfo.Count());
            // Use the block's yield type to continue type check
            for (uint32 i = 0; i < info.Count(); ++i)
            {
                info.SetInfo(EmitInfo(blockInfo->yieldInfo.GetInfo(i).type), i);
            }
        }
    }

    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrTrue_Int, blockInfo->label, conditionInfo.location);

    return info;
}